

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int read_private_key_from_file
              (void **key_ctx,pem_read_bio_func read_private_key,char *filename,uchar *passphrase)

{
  BIO *a;
  void *pvVar1;
  int iVar2;
  
  *key_ctx = (void *)0x0;
  a = BIO_new_file(filename,"r");
  if (a == (BIO *)0x0) {
    iVar2 = -1;
  }
  else {
    pvVar1 = (*read_private_key)((BIO *)a,(void **)0x0,passphrase_cb,passphrase);
    *key_ctx = pvVar1;
    BIO_free(a);
    iVar2 = -(uint)(*key_ctx == (void *)0x0);
  }
  return iVar2;
}

Assistant:

static int
read_private_key_from_file(void **key_ctx,
                           pem_read_bio_func read_private_key,
                           const char *filename,
                           unsigned const char *passphrase)
{
    BIO * bp;

    *key_ctx = NULL;

    bp = BIO_new_file(filename, "r");
    if(!bp) {
        return -1;
    }

    *key_ctx = read_private_key(bp, NULL, (pem_password_cb *) passphrase_cb,
                                (void *) passphrase);

    BIO_free(bp);
    return (*key_ctx) ? 0 : -1;
}